

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O2

bool setUpContainer(Container *container)

{
  Verbosity VVar1;
  int iVar2;
  runtime_error *this;
  double __x;
  double __x_00;
  double __x_01;
  thread local_1f8;
  thread networkWorker;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [8];
  string currentUser;
  string containerDir;
  Container *container_local;
  
  containerDir.field_2._8_8_ = container;
  VVar1 = loguru::current_verbosity_cutoff();
  if (-1 < VVar1) {
    loguru::log(__x);
  }
  setUpContainerImage(container);
  if (container->buildImage == false) {
    setUpContainerOverlayFs(container);
  }
  std::__cxx11::string::string((string *)local_70,(string *)&container->currentUser);
  std::__cxx11::string::string
            ((string *)(currentUser.field_2._M_local_buf + 8),(string *)&container->dir);
  sprintf((char *)&local_1f8,"chown -R %s %s",local_70,currentUser.field_2._8_8_);
  iVar2 = system((char *)&local_1f8);
  if (iVar2 != -1) {
    VVar1 = loguru::current_verbosity_cutoff();
    if (-1 < VVar1) {
      loguru::log(__x_00);
    }
    VVar1 = loguru::current_verbosity_cutoff();
    if (-1 < VVar1) {
      loguru::log(__x_01);
    }
    std::__cxx11::string::~string((string *)(currentUser.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_70);
    std::thread::thread<void(&)(Container*),Container*&,void>
              (&local_1f8,initializeContainerNetwork,(Container **)((long)&containerDir.field_2 + 8)
              );
    std::thread::detach();
    std::thread::~thread(&local_1f8);
    return true;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_90,"Make",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  std::operator+(&local_b0,&local_90," the owner of ");
  std::operator+(&local_d0,&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&currentUser.field_2 + 8));
  std::operator+(&local_f0,&local_d0,": FAILED");
  std::runtime_error::runtime_error(this,(string *)&local_f0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool setUpContainer(Container* container)
{
    LOG_F(INFO, "Set up container %s", container->id.c_str());
    try
    {
        setUpContainerImage(container);
        if (!container->buildImage)
            setUpContainerOverlayFs(container);

        // Makes the current user the owner of the container directory
        char buffer[256];
        std::string currentUser = container->currentUser;
        std::string containerDir = container->dir;
        sprintf(buffer, "chown -R %s %s", currentUser.c_str(), containerDir.c_str());
        if (system(buffer) == -1)
            throw std::runtime_error("Make" + currentUser + " the owner of " + containerDir + ": FAILED");
        else
            LOG_F(INFO, "Setting the owner of %s to %s", containerDir.c_str(), currentUser.c_str());
        LOG_F(INFO, "Set up container %s: SUCCESS", container->id.c_str());
    }
    catch (std::exception& ex)
    {
        LOG_F(ERROR, "Set up container %s: FAILED", container->id.c_str());
        LOG_F(ERROR, "%s", ex.what());
        return false;
    }
    // Spawns a worker thread to initialize the network environment for the container
    std::thread networkWorker(initializeContainerNetwork, container);
    networkWorker.detach();
    return true;
}